

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleWithName(ProgramImpl *this,string *name)

{
  long *plVar1;
  void *__s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  undefined8 *in_RDX;
  long lVar4;
  pool_ref<soul::Module> *m;
  long *plVar5;
  bool bVar6;
  
  plVar5 = (long *)name[2]._M_dataplus._M_p;
  plVar1 = (long *)name[2]._M_string_length;
  bVar6 = plVar5 == plVar1;
  if (!bVar6) {
    __s2 = (void *)*in_RDX;
    sVar2 = in_RDX[1];
    do {
      lVar4 = *plVar5;
      __n = *(size_t *)(lVar4 + 0x38);
      if ((__n == sVar2) &&
         ((__n == 0 || (iVar3 = bcmp(*(void **)(lVar4 + 0x30),__s2,__n), iVar3 == 0)))) {
        if (!bVar6) goto LAB_001c6f67;
        break;
      }
      plVar5 = plVar5 + 1;
      bVar6 = plVar5 == plVar1;
    } while (!bVar6);
  }
  lVar4 = 0;
LAB_001c6f67:
  *(long *)this = lVar4;
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleWithName (const std::string& name) const
    {
        for (auto& m : modules)
            if (m->fullName == name)
                return m;

        return {};
    }